

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_IsRootDirectory_Test::Body
          (iu_FilePath_x_iutest_x_IsRootDirectory_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_698;
  AssertionHelper local_678;
  Fixed local_648;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult iutest_ar_2;
  FilePath path_2;
  AssertionHelper local_450;
  Fixed local_420;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult iutest_ar_1;
  FilePath path_1;
  AssertionHelper local_228;
  Fixed local_1f8;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_IsRootDirectory_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30);
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::iuFilePath::IsRootDirectory((iuFilePath *)local_30);
  local_69 = (bool)(~bVar1 & 1);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_68,&local_69);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&path_1.m_path.field_2 + 8),(internal *)local_68,
               (AssertionResult *)"path.IsRootDirectory()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x4e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    std::__cxx11::string::~string((string *)(path_1.m_path.field_2._M_local_buf + 8));
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_1.m_result,"path");
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::iuFilePath::IsRootDirectory((iuFilePath *)&iutest_ar_1.m_result);
  local_291 = (bool)(~bVar1 & 1);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_290,&local_291);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    memset(&local_420,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_420);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&path_2.m_path.field_2 + 8),(internal *)local_290,
               (AssertionResult *)"path.IsRootDirectory()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x52,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_450,&local_420);
    iutest::AssertionHelper::~AssertionHelper(&local_450);
    std::__cxx11::string::~string((string *)(path_2.m_path.field_2._M_local_buf + 8));
    iutest::AssertionHelper::Fixed::~Fixed(&local_420);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_1.m_result);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_2.m_result,"/");
  iutest::detail::AlwaysZero();
  local_4b9 = iutest::detail::iuFilePath::IsRootDirectory((iuFilePath *)&iutest_ar_2.m_result);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_4b8,&local_4b9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    memset(&local_648,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_648);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_698,(internal *)local_4b8,(AssertionResult *)"path.IsRootDirectory()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x5a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_678,&local_648);
    iutest::AssertionHelper::~AssertionHelper(&local_678);
    std::__cxx11::string::~string((string *)&local_698);
    iutest::AssertionHelper::Fixed::~Fixed(&local_648);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_2.m_result);
  return;
}

Assistant:

IUTEST(FilePath, IsRootDirectory)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
        ::iutest::internal::FilePath path("path");
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
#ifdef IUTEST_OS_WINDOWS
        ::iutest::internal::FilePath path("C:\\");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#else
        ::iutest::internal::FilePath path("/");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#endif
    }
}